

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O2

void __thiscall asl::XdlEncoder::new_property(XdlEncoder *this,String *name)

{
  char *b;
  
  if (this->_json == true) {
    new_string(this,name);
    b = ":";
    if (this->_pretty != false) {
      b = ": ";
    }
    String::operator+=(&this->_out,b);
    return;
  }
  String::operator+=(&this->_out,name);
  String::operator+=(&this->_out,'=');
  return;
}

Assistant:

void XdlEncoder::new_property(const String& name)
{
	if (_json)
	{
		new_string(name);
		_out << (_pretty ? ": " : ":");
	}
	else
		_out << name << '=';
}